

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O3

int mbedtls_md_hmac_finish(mbedtls_md_context_t *ctx,uchar *output)

{
  byte bVar1;
  mbedtls_md_info_t *pmVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  uchar local_58 [8];
  uchar tmp [32];
  
  iVar5 = -0x5100;
  iVar4 = iVar5;
  if ((((ctx != (mbedtls_md_context_t *)0x0) &&
       (pmVar2 = ctx->md_info, pmVar2 != (mbedtls_md_info_t *)0x0)) &&
      (pvVar3 = ctx->hmac_ctx, pvVar3 != (void *)0x0)) &&
     ((pmVar2->type & 0xfffffffe) == MBEDTLS_MD_SHA224)) {
    bVar1 = pmVar2->block_size;
    iVar4 = mbedtls_sha256_finish((mbedtls_sha256_context_conflict *)ctx->md_ctx,local_58);
    if (((((iVar4 == 0) && (iVar4 = mbedtls_md_starts(ctx), iVar4 == 0)) &&
         ((iVar4 = iVar5, (ctx->md_info->type & 0xfffffffe) == MBEDTLS_MD_SHA224 &&
          ((iVar4 = mbedtls_sha256_update
                              ((mbedtls_sha256_context_conflict *)ctx->md_ctx,
                               (uchar *)((long)pvVar3 + (ulong)bVar1),
                               (ulong)ctx->md_info->block_size), iVar4 == 0 &&
           (iVar4 = iVar5, (ctx->md_info->type & 0xfffffffe) == MBEDTLS_MD_SHA224)))))) &&
        (iVar4 = mbedtls_sha256_update
                           ((mbedtls_sha256_context_conflict *)ctx->md_ctx,local_58,
                            (ulong)ctx->md_info->size), iVar4 == 0)) &&
       ((iVar4 = iVar5, ctx->md_info != (mbedtls_md_info_t *)0x0 &&
        ((ctx->md_info->type & 0xfffffffe) == MBEDTLS_MD_SHA224)))) {
      iVar4 = mbedtls_sha256_finish((mbedtls_sha256_context_conflict *)ctx->md_ctx,output);
    }
  }
  return iVar4;
}

Assistant:

int mbedtls_md_hmac_finish(mbedtls_md_context_t *ctx, unsigned char *output)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char tmp[MBEDTLS_MD_MAX_SIZE];
    unsigned char *opad;

    if (ctx == NULL || ctx->md_info == NULL || ctx->hmac_ctx == NULL) {
        return MBEDTLS_ERR_MD_BAD_INPUT_DATA;
    }

    opad = (unsigned char *) ctx->hmac_ctx + ctx->md_info->block_size;

    if ((ret = mbedtls_md_finish(ctx, tmp)) != 0) {
        return ret;
    }
    if ((ret = mbedtls_md_starts(ctx)) != 0) {
        return ret;
    }
    if ((ret = mbedtls_md_update(ctx, opad,
                                 ctx->md_info->block_size)) != 0) {
        return ret;
    }
    if ((ret = mbedtls_md_update(ctx, tmp,
                                 ctx->md_info->size)) != 0) {
        return ret;
    }
    return mbedtls_md_finish(ctx, output);
}